

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_object.cxx
# Opt level: O0

void __thiscall xray_re::xr_object::clear(xr_object *this)

{
  xr_object *this_local;
  
  this->m_flags = 0;
  std::__cxx11::string::operator=((string *)&this->m_owner_name,"unknown");
  this->m_creation_time = 0;
  std::__cxx11::string::operator=((string *)&this->m_modif_name,"unknown");
  this->m_modified_time = 0;
  clear_container<std::vector<xray_re::xr_surface*,std::allocator<xray_re::xr_surface*>>>
            (&this->m_surfaces);
  clear_container<std::vector<xray_re::xr_mesh*,std::allocator<xray_re::xr_mesh*>>>(&this->m_meshes)
  ;
  clear_container<std::vector<xray_re::xr_bone*,std::allocator<xray_re::xr_bone*>>>(&this->m_bones);
  clear_container<std::vector<xray_re::xr_skl_motion*,std::allocator<xray_re::xr_skl_motion*>>>
            (&this->m_motions);
  clear_container<std::vector<xray_re::xr_partition*,std::allocator<xray_re::xr_partition*>>>
            (&this->m_partitions);
  return;
}

Assistant:

void xr_object::clear()
{
	m_flags = EOF_STATIC;
	m_owner_name = "unknown";
	m_creation_time = 0;
	m_modif_name = "unknown";
	m_modified_time = 0;
	clear_container(m_surfaces);
	clear_container(m_meshes);
	clear_container(m_bones);
	clear_container(m_motions);
	clear_container(m_partitions);
}